

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cc
# Opt level: O0

void __thiscall pstack::LzmaReader::LzmaReader(LzmaReader *this,csptr *upstream_)

{
  int iVar1;
  unsigned_long uVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  uchar auStack_478 [8];
  size_t local_470;
  Exception *local_468;
  Exception *local_460;
  Exception *local_458;
  lzma_index **local_450;
  uint64_t *local_448;
  lzma_allocator *local_440;
  uchar *local_438;
  Exception *local_430;
  size_t local_428;
  Exception *local_420;
  Exception *local_418;
  Exception *local_410;
  csptr *local_408;
  LzmaReader *local_400;
  map<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *local_3f8;
  __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_3f0;
  long local_3e8;
  undefined1 local_3d9;
  Exception local_3d8;
  undefined8 local_238;
  unsigned_long __vla_expr0;
  undefined1 local_221;
  Exception local_220;
  lzma_ret local_80 [2];
  lzma_ret rc;
  Off local_70;
  size_t off;
  uint8_t footer [12];
  lzma_stream_flags options;
  csptr *upstream__local;
  LzmaReader *this_local;
  
  local_408 = upstream_;
  local_400 = this;
  Reader::Reader(&this->super_Reader);
  (local_400->super_Reader)._vptr_Reader = (_func_int **)&PTR__LzmaReader_002f2b68;
  local_400->index = (lzma_index *)0x0;
  uVar2 = std::numeric_limits<unsigned_long>::max();
  local_400->memlimit = uVar2;
  local_400->pos = 0;
  local_3f0 = (__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
              )&local_400->upstream;
  std::shared_ptr<const_pstack::Reader>::shared_ptr
            ((shared_ptr<const_pstack::Reader> *)local_3f0,local_408);
  local_3f8 = &local_400->lzBlocks;
  std::
  map<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map(local_3f8);
  footer[4] = '\0';
  footer[5] = '\0';
  footer[6] = '\0';
  footer[7] = '\0';
  footer[8] = '\0';
  footer[9] = '\0';
  footer[10] = '\0';
  footer[0xb] = '\0';
  peVar3 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_3f0);
  iVar1 = (*peVar3->_vptr_Reader[8])();
  local_3e8 = CONCAT44(extraout_var,iVar1);
  local_70 = local_3e8 - 0xc;
  peVar3 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_400->upstream);
  Reader::readObj<unsigned_char>(peVar3,local_70,(uchar *)((long)&off + 4),0xc);
  local_80[0] = lzma_stream_footer_decode(footer + 4);
  if (local_80[0] != LZMA_OK) {
    local_221 = 1;
    local_428 = 0x1a0;
    local_420 = (Exception *)__cxa_allocate_exception();
    local_418 = &local_220;
    memset(local_418,0,local_428);
    Exception::Exception(local_418);
    local_410 = Exception::operator<<(local_418,(char (*) [28])"LZMA error reading footer: ");
    local_430 = Exception::operator<<(local_410,local_80);
    Exception::Exception(local_420,local_430);
    local_221 = 0;
    __cxa_throw(local_420,&Exception::typeinfo,Exception::~Exception);
  }
  local_238 = 0;
  local_438 = auStack_478;
  __vla_expr0 = (unsigned_long)auStack_478;
  peVar3 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_400->upstream);
  Reader::readObj<unsigned_char>(peVar3,local_70,local_438,0);
  local_450 = &local_400->index;
  local_448 = &local_400->memlimit;
  local_440 = pstack::allocator();
  local_80[0] = lzma_index_buffer_decode(local_450,local_448,local_440,local_438,&local_400->pos,0);
  if (local_80[0] != LZMA_OK) {
    local_3d9 = 1;
    local_470 = 0x1a0;
    local_468 = (Exception *)__cxa_allocate_exception();
    local_460 = &local_3d8;
    memset(local_460,0,local_470);
    Exception::Exception(local_460);
    local_458 = Exception::operator<<(local_460,(char (*) [26])"can\'t decode index buffer");
    Exception::Exception(local_468,local_458);
    local_3d9 = 0;
    __cxa_throw(local_468,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

LzmaReader::LzmaReader(Reader::csptr upstream_)
    : index{}
    , upstream{std::move(upstream_)}
{
   lzma_stream_flags options{};

   // read the last LZMA_STREAM_HEADER_SIZE bytes into footer.
   uint8_t footer[LZMA_STREAM_HEADER_SIZE];
   size_t off = upstream->size() - sizeof footer;
   upstream->readObj(off, footer, sizeof footer);

   auto rc = lzma_stream_footer_decode(&options, footer);
   if (rc != LZMA_OK)
       throw (Exception() << "LZMA error reading footer: " << rc);
   off -= options.backward_size;
   uint8_t indexBuffer[options.backward_size];
   upstream->readObj(off, indexBuffer, options.backward_size);
   rc = lzma_index_buffer_decode(&index, &memlimit, allocator(), indexBuffer, &pos,
         options.backward_size);
   if (rc != LZMA_OK)
       throw (Exception() << "can't decode index buffer");
}